

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAtomicCounterTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::specToTestName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TestSpec *spec)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream stream;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  poVar1 = (ostream *)std::ostream::operator<<((ostringstream *)&local_190,*(int *)this);
  pcVar2 = "_counters";
  if (*(int *)this == 1) {
    pcVar2 = "_counter";
  }
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(&local_190,"_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(this + 8));
  pcVar2 = "_calls";
  if (*(int *)(this + 8) == 1) {
    pcVar2 = "_call";
  }
  std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(&local_190,"_");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,*(int *)(this + 0x10));
  pcVar2 = "_threads";
  if (*(int *)(this + 0x10) == 1) {
    pcVar2 = "_thread";
  }
  std::operator<<(poVar1,pcVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

string specToTestName (const AtomicCounterTest::TestSpec& spec)
{
	std::ostringstream stream;

	stream << spec.atomicCounterCount	<< (spec.atomicCounterCount == 1 ? "_counter" : "_counters");
	stream << "_" << spec.callCount		<< (spec.callCount == 1 ? "_call" : "_calls");
	stream << "_" << spec.threadCount	<< (spec.threadCount == 1 ? "_thread" : "_threads");

	return stream.str();
}